

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::loadScene(Application *this,char *filename)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  SceneInfo *sceneInfo;
  Camera originalCanonicalCamera;
  Camera originalCamera;
  undefined8 auStack_340 [40];
  undefined8 uStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double dStack_198;
  double local_190;
  double dStack_188;
  double local_180 [10];
  size_t local_130;
  size_t sStack_128;
  double local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  size_t local_50;
  size_t sStack_48;
  double local_40;
  
  uStack_200 = 0x18c50c;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Loading scene from file ",0x18);
  if (filename == (char *)0x0) {
    uStack_200 = 0x18c544;
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x31ebc8);
  }
  else {
    uStack_200 = 0x18c519;
    sVar2 = strlen(filename);
    uStack_200 = 0x18c52b;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar2);
  }
  uStack_200 = 0x18c558;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  uStack_200 = 0x18c563;
  std::ostream::put(-0x38);
  uStack_200 = 0x18c56b;
  std::ostream::flush();
  local_f8 = (this->camera).fClip;
  local_118 = (this->camera).hFov;
  dStack_110 = (this->camera).vFov;
  local_108 = (this->camera).ar;
  dStack_100 = (this->camera).nClip;
  local_f0 = (this->camera).pos.x;
  local_e8 = (this->camera).pos.y;
  local_e0 = (this->camera).pos.z;
  local_d8 = (this->camera).targetPos.x;
  local_d0 = (this->camera).targetPos.y;
  local_c8 = (this->camera).targetPos.z;
  local_c0 = (this->camera).phi;
  dStack_b8 = (this->camera).theta;
  local_b0 = (this->camera).r;
  dStack_a8 = (this->camera).minR;
  local_a0 = (this->camera).maxR;
  lVar3 = 0xe8;
  do {
    *(undefined8 *)((long)local_180 + lVar3) = *(undefined8 *)((long)this + lVar3 + -0x10);
    *(undefined8 *)((long)local_180 + lVar3 + 8) = *(undefined8 *)((long)this + lVar3 + -8);
    *(undefined8 *)((long)local_180 + lVar3 + 0x10) =
         *(undefined8 *)((long)&(this->super_Renderer)._vptr_Renderer + lVar3);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x130);
  local_40 = (this->camera).screenDist;
  local_50 = (this->camera).screenW;
  sStack_48 = (this->camera).screenH;
  local_1d8 = (this->canonicalCamera).fClip;
  local_1f8 = (this->canonicalCamera).hFov;
  dStack_1f0 = (this->canonicalCamera).vFov;
  local_1e8 = (this->canonicalCamera).ar;
  dStack_1e0 = (this->canonicalCamera).nClip;
  local_1d0 = (this->canonicalCamera).pos.x;
  local_1c8 = (this->canonicalCamera).pos.y;
  local_1c0 = (this->canonicalCamera).pos.z;
  local_1b8 = (this->canonicalCamera).targetPos.x;
  local_1b0 = (this->canonicalCamera).targetPos.y;
  local_1a8 = (this->canonicalCamera).targetPos.z;
  local_1a0 = (this->canonicalCamera).phi;
  dStack_198 = (this->canonicalCamera).theta;
  local_190 = (this->canonicalCamera).r;
  dStack_188 = (this->canonicalCamera).minR;
  local_180[0] = (this->canonicalCamera).maxR;
  lVar3 = 0x1c8;
  do {
    *(undefined8 *)((long)auStack_340 + lVar3) = *(undefined8 *)((long)this + lVar3 + -0x10);
    *(undefined8 *)((long)auStack_340 + lVar3 + 8) = *(undefined8 *)((long)this + lVar3 + -8);
    *(undefined8 *)((long)auStack_340 + lVar3 + 0x10) =
         *(undefined8 *)((long)&(this->super_Renderer)._vptr_Renderer + lVar3);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x210);
  local_120 = (this->canonicalCamera).screenDist;
  local_130 = (this->canonicalCamera).screenW;
  sStack_128 = (this->canonicalCamera).screenH;
  uStack_200 = 0x18c7a1;
  sceneInfo = (SceneInfo *)operator_new(0x18);
  (sceneInfo->nodes).
  super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (sceneInfo->nodes).
  super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (sceneInfo->nodes).
  super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_200 = 0x18c7bd;
  iVar1 = Collada::ColladaParser::load(filename,sceneInfo);
  if (-1 < iVar1) {
    uStack_200 = 0x18c7cc;
    load(this,sceneInfo);
    uStack_200 = 0x18c7db;
    loadSkeleton(this,filename,this->scene);
    uStack_200 = 0x18c7f0;
    memcpy(&this->camera,&local_118,0xe0);
    uStack_200 = 0x18c800;
    memcpy(&this->canonicalCamera,&local_1f8,0xe0);
    return;
  }
  uStack_200 = 0x18c826;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Warning: scene file failed to load.",0x23);
  uStack_200 = 0x18c83a;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  uStack_200 = 0x18c845;
  std::ostream::put(-0x38);
  uStack_200 = 0x18c84d;
  std::ostream::flush();
  uStack_200 = 0x18c855;
  std::vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>::~vector
            ((vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_> *)sceneInfo);
  operator_delete(sceneInfo,0x18);
  return;
}

Assistant:

void Application::loadScene( const char* filename )
{
   cerr << "Loading scene from file " << filename << endl;

   Camera originalCamera = camera;
   Camera originalCanonicalCamera = canonicalCamera;

   Collada::SceneInfo *sceneInfo = new Collada::SceneInfo();
   if (Collada::ColladaParser::load(filename, sceneInfo) < 0)
   {
      cerr << "Warning: scene file failed to load." << endl;
      delete sceneInfo;
      return;
   }
   load(sceneInfo);
   loadSkeleton(filename, scene);

   camera = originalCamera;
   canonicalCamera = originalCanonicalCamera;
}